

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

Animation * __thiscall
rlottie::internal::model::Property<VPointF,_void>::animation(Property<VPointF,_void> *this)

{
  pointer pKVar1;
  unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
  *in_RDI;
  Property<VPointF,_void> *in_stack_fffffffffffffff0;
  
  if (((ulong)in_RDI[1]._M_t.
              super___uniq_ptr_impl<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_rlottie::internal::model::KeyFrames<VPointF,_void>_*,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
              .super__Head_base<0UL,_rlottie::internal::model::KeyFrames<VPointF,_void>_*,_false>.
              _M_head_impl & 1) != 0) {
    destroy(in_stack_fffffffffffffff0);
    std::make_unique<rlottie::internal::model::KeyFrames<VPointF,void>>();
    Property<VPointF,void>::
    construct<std::unique_ptr<rlottie::internal::model::KeyFrames<VPointF,void>,std::default_delete<rlottie::internal::model::KeyFrames<VPointF,void>>>>
              (in_stack_fffffffffffffff0,in_RDI,
               (unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
                *)0x1993ec);
    std::
    unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
    ::~unique_ptr((unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
                   *)in_stack_fffffffffffffff0);
    *(undefined1 *)
     &in_RDI[1]._M_t.
      super___uniq_ptr_impl<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_rlottie::internal::model::KeyFrames<VPointF,_void>_*,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
      .super__Head_base<0UL,_rlottie::internal::model::KeyFrames<VPointF,_void>_*,_false>.
      _M_head_impl = 0;
  }
  pKVar1 = std::
           unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
           ::get((unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
                  *)0x199407);
  return pKVar1;
}

Assistant:

Animation &animation()
    {
        if (isValue_) {
            destroy();
            construct(impl_.animation_, std::make_unique<Animation>());
            isValue_ = false;
        }
        return *(impl_.animation_.get());
    }